

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O2

int32_t uloc_getScript_63(char *localeID,char *script,int32_t scriptCapacity,UErrorCode *err)

{
  int32_t iVar1;
  char *local_30;
  
  iVar1 = 0;
  if ((err != (UErrorCode *)0x0) && (iVar1 = 0, *err < U_ILLEGAL_ARGUMENT_ERROR)) {
    local_30 = localeID;
    if (localeID == (char *)0x0) {
      local_30 = locale_get_default_63();
    }
    iVar1 = 0;
    ulocimp_getLanguage_63(local_30,(char *)0x0,0,&local_30);
    if ((*local_30 == '_') || (*local_30 == '-')) {
      iVar1 = ulocimp_getScript_63(local_30 + 1,script,scriptCapacity,(char **)0x0);
    }
    iVar1 = u_terminateChars_63(script,scriptCapacity,iVar1,err);
  }
  return iVar1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_getScript(const char*    localeID,
         char* script,
         int32_t scriptCapacity,
         UErrorCode* err)
{
    int32_t i=0;

    if(err==NULL || U_FAILURE(*err)) {
        return 0;
    }

    if(localeID==NULL) {
        localeID=uloc_getDefault();
    }

    /* skip the language */
    ulocimp_getLanguage(localeID, NULL, 0, &localeID);
    if(_isIDSeparator(*localeID)) {
        i=ulocimp_getScript(localeID+1, script, scriptCapacity, NULL);
    }
    return u_terminateChars(script, scriptCapacity, i, err);
}